

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O1

bool s2pred::ArePointsLinearlyDependent(Vector3_xf *x,Vector3_xf *y)

{
  bool bVar1;
  long lVar2;
  Vector3_xf n;
  undefined8 uStack_48;
  Vector3<ExactFloat> local_40;
  
  Vector3<ExactFloat>::CrossProd(&local_40,x,y);
  if ((((local_40.c_[0].bn_exp_ & 0xfffffffdU) == 0x7ffffffd) || (local_40.c_[0].sign_ == 0)) &&
     (((local_40.c_[1].bn_exp_ & 0xfffffffdU) == 0x7ffffffd || (local_40.c_[1].sign_ == 0)))) {
    bVar1 = local_40.c_[2].sign_ == 0 || (local_40.c_[2].bn_exp_ & 0xfffffffdU) == 0x7ffffffd;
  }
  else {
    bVar1 = false;
  }
  lVar2 = 0x30;
  do {
    BN_free(*(BIGNUM **)((long)&uStack_48 + lVar2));
    lVar2 = lVar2 + -0x10;
  } while (lVar2 != 0);
  return bVar1;
}

Assistant:

bool ArePointsLinearlyDependent(const Vector3_xf& x, const Vector3_xf& y) {
  Vector3_xf n = x.CrossProd(y);
  return n[0].sgn() == 0 && n[1].sgn() == 0 && n[2].sgn() == 0;
}